

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FxchDiv.c
# Opt level: O0

int Fxch_DivCreate(Fxch_Man_t *pFxchMan,Fxch_SubCube_t *pSubCube0,Fxch_SubCube_t *pSubCube1)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  Vec_Int_t *pVVar5;
  int RetValue;
  int Cube1Size;
  int Cube0Size;
  int SC1_Lit1;
  int SC1_Lit0;
  int SC0_Lit1;
  int SC0_Lit0;
  int Base;
  Fxch_SubCube_t *pSubCube1_local;
  Fxch_SubCube_t *pSubCube0_local;
  Fxch_Man_t *pFxchMan_local;
  
  Vec_IntClear(pFxchMan->vCubeFree);
  iVar1 = Fxch_ManGetLit(pFxchMan,pSubCube0->iCube,*(uint *)&pSubCube0->field_0x8 & 0xffff);
  iVar2 = Fxch_ManGetLit(pFxchMan,pSubCube1->iCube,*(uint *)&pSubCube1->field_0x8 & 0xffff);
  if ((*(uint *)&pSubCube0->field_0x8 >> 0x10 == 0) && (*(uint *)&pSubCube1->field_0x8 >> 0x10 == 0)
     ) {
    Vec_IntPush(pFxchMan->vCubeFree,iVar1);
    Vec_IntPush(pFxchMan->vCubeFree,iVar2);
  }
  else if ((*(uint *)&pSubCube0->field_0x8 >> 0x10 == 0) ||
          (*(uint *)&pSubCube1->field_0x8 >> 0x10 == 0)) {
    if (*(uint *)&pSubCube0->field_0x8 >> 0x10 == 0) {
      iVar4 = Fxch_ManGetLit(pFxchMan,pSubCube1->iCube,*(uint *)&pSubCube1->field_0x8 >> 0x10);
      Vec_IntPush(pFxchMan->vCubeFree,iVar1);
      iVar3 = Abc_LitNot(iVar1);
      if (iVar2 == iVar3) {
        Vec_IntPush(pFxchMan->vCubeFree,iVar4);
      }
      else {
        iVar1 = Abc_LitNot(iVar1);
        if (iVar4 == iVar1) {
          Vec_IntPush(pFxchMan->vCubeFree,iVar2);
        }
      }
    }
    else {
      iVar4 = Fxch_ManGetLit(pFxchMan,pSubCube0->iCube,*(uint *)&pSubCube0->field_0x8 >> 0x10);
      Vec_IntPush(pFxchMan->vCubeFree,iVar2);
      iVar3 = Abc_LitNot(iVar2);
      if (iVar1 == iVar3) {
        Vec_IntPush(pFxchMan->vCubeFree,iVar4);
      }
      else {
        iVar2 = Abc_LitNot(iVar2);
        if (iVar4 == iVar2) {
          Vec_IntPush(pFxchMan->vCubeFree,iVar1);
        }
      }
    }
  }
  else {
    iVar4 = Fxch_ManGetLit(pFxchMan,pSubCube0->iCube,*(uint *)&pSubCube0->field_0x8 >> 0x10);
    iVar3 = Fxch_ManGetLit(pFxchMan,pSubCube1->iCube,*(uint *)&pSubCube1->field_0x8 >> 0x10);
    if (iVar1 < iVar2) {
      pVVar5 = pFxchMan->vCubeFree;
      iVar1 = Abc_Var2Lit(iVar1,0);
      Vec_IntPush(pVVar5,iVar1);
      pVVar5 = pFxchMan->vCubeFree;
      iVar1 = Abc_Var2Lit(iVar2,1);
      Vec_IntPush(pVVar5,iVar1);
      pVVar5 = pFxchMan->vCubeFree;
      iVar1 = Abc_Var2Lit(iVar4,0);
      Vec_IntPush(pVVar5,iVar1);
      pVVar5 = pFxchMan->vCubeFree;
      iVar1 = Abc_Var2Lit(iVar3,1);
      Vec_IntPush(pVVar5,iVar1);
    }
    else {
      pVVar5 = pFxchMan->vCubeFree;
      iVar2 = Abc_Var2Lit(iVar2,0);
      Vec_IntPush(pVVar5,iVar2);
      pVVar5 = pFxchMan->vCubeFree;
      iVar1 = Abc_Var2Lit(iVar1,1);
      Vec_IntPush(pVVar5,iVar1);
      pVVar5 = pFxchMan->vCubeFree;
      iVar1 = Abc_Var2Lit(iVar3,0);
      Vec_IntPush(pVVar5,iVar1);
      pVVar5 = pFxchMan->vCubeFree;
      iVar1 = Abc_Var2Lit(iVar4,1);
      Vec_IntPush(pVVar5,iVar1);
    }
    iVar1 = Fxch_DivNormalize(pFxchMan->vCubeFree);
    if (iVar1 == -1) {
      return -1;
    }
  }
  iVar1 = Vec_IntSize(pFxchMan->vCubeFree);
  if (iVar1 == 0) {
    pFxchMan_local._4_4_ = -1;
  }
  else {
    iVar1 = Vec_IntSize(pFxchMan->vCubeFree);
    if (iVar1 == 2) {
      Vec_IntSort(pFxchMan->vCubeFree,0);
      pVVar5 = pFxchMan->vCubeFree;
      iVar1 = Vec_IntEntry(pFxchMan->vCubeFree,0);
      iVar1 = Abc_Var2Lit(iVar1,0);
      Vec_IntWriteEntry(pVVar5,0,iVar1);
      pVVar5 = pFxchMan->vCubeFree;
      iVar1 = Vec_IntEntry(pFxchMan->vCubeFree,1);
      iVar1 = Abc_Var2Lit(iVar1,1);
      Vec_IntWriteEntry(pVVar5,1,iVar1);
    }
    pVVar5 = Fxch_ManGetCube(pFxchMan,pSubCube0->iCube);
    iVar1 = Vec_IntSize(pVVar5);
    pVVar5 = Fxch_ManGetCube(pFxchMan,pSubCube1->iCube);
    iVar2 = Vec_IntSize(pVVar5);
    iVar4 = Vec_IntSize(pFxchMan->vCubeFree);
    if (iVar4 % 2 == 0) {
      iVar1 = Abc_MinInt(iVar1,iVar2);
      iVar2 = Vec_IntSize(pFxchMan->vCubeFree);
      pFxchMan_local._4_4_ = (iVar1 - iVar2 / 2) + -1;
    }
    else {
      pFxchMan_local._4_4_ = -1;
    }
  }
  return pFxchMan_local._4_4_;
}

Assistant:

int Fxch_DivCreate( Fxch_Man_t* pFxchMan,
                    Fxch_SubCube_t* pSubCube0,
                    Fxch_SubCube_t* pSubCube1 )
{
    int Base = 0;

    int SC0_Lit0,
        SC0_Lit1,
        SC1_Lit0,
        SC1_Lit1;

    int Cube0Size,
        Cube1Size;

    Vec_IntClear( pFxchMan->vCubeFree );

    SC0_Lit0 = Fxch_ManGetLit( pFxchMan, pSubCube0->iCube, pSubCube0->iLit0 );
    SC0_Lit1 = 0;
    SC1_Lit0 = Fxch_ManGetLit( pFxchMan, pSubCube1->iCube, pSubCube1->iLit0 );
    SC1_Lit1 = 0;

    if ( pSubCube0->iLit1 == 0 && pSubCube1->iLit1 == 0 )
    {
        Vec_IntPush( pFxchMan->vCubeFree, SC0_Lit0 );
        Vec_IntPush( pFxchMan->vCubeFree, SC1_Lit0 );
    }
    else if ( pSubCube0->iLit1 > 0 && pSubCube1->iLit1 > 0 )
    {
        int RetValue;

        SC0_Lit1 = Fxch_ManGetLit( pFxchMan, pSubCube0->iCube, pSubCube0->iLit1 );
        SC1_Lit1 = Fxch_ManGetLit( pFxchMan, pSubCube1->iCube, pSubCube1->iLit1 );

        if ( SC0_Lit0 < SC1_Lit0 )
        {
            Vec_IntPush( pFxchMan->vCubeFree, Abc_Var2Lit( SC0_Lit0, 0 ) );
            Vec_IntPush( pFxchMan->vCubeFree, Abc_Var2Lit( SC1_Lit0, 1 ) );
            Vec_IntPush( pFxchMan->vCubeFree, Abc_Var2Lit( SC0_Lit1, 0 ) );
            Vec_IntPush( pFxchMan->vCubeFree, Abc_Var2Lit( SC1_Lit1, 1 ) );
        }
        else
        {
            Vec_IntPush( pFxchMan->vCubeFree, Abc_Var2Lit( SC1_Lit0, 0 ) );
            Vec_IntPush( pFxchMan->vCubeFree, Abc_Var2Lit( SC0_Lit0, 1 ) );
            Vec_IntPush( pFxchMan->vCubeFree, Abc_Var2Lit( SC1_Lit1, 0 ) );
            Vec_IntPush( pFxchMan->vCubeFree, Abc_Var2Lit( SC0_Lit1, 1 ) );
        }

        RetValue = Fxch_DivNormalize( pFxchMan->vCubeFree );
        if ( RetValue == -1 )
            return -1;
    } 
    else
    {
        if ( pSubCube0->iLit1 > 0 )
        {
            SC0_Lit1 = Fxch_ManGetLit( pFxchMan, pSubCube0->iCube, pSubCube0->iLit1 );

            Vec_IntPush( pFxchMan->vCubeFree, SC1_Lit0 );
            if ( SC0_Lit0 == Abc_LitNot( SC1_Lit0 ) )
                Vec_IntPush( pFxchMan->vCubeFree, SC0_Lit1 );
            else if ( SC0_Lit1 == Abc_LitNot( SC1_Lit0 ) )
                Vec_IntPush( pFxchMan->vCubeFree, SC0_Lit0 );
        }
        else 
        {
            SC1_Lit1 = Fxch_ManGetLit( pFxchMan, pSubCube1->iCube, pSubCube1->iLit1 );

            Vec_IntPush( pFxchMan->vCubeFree, SC0_Lit0 );
            if ( SC1_Lit0 == Abc_LitNot( SC0_Lit0 ) )
                Vec_IntPush( pFxchMan->vCubeFree, SC1_Lit1 );
            else if ( SC1_Lit1 == Abc_LitNot( SC0_Lit0 ) )
                Vec_IntPush( pFxchMan->vCubeFree, SC1_Lit0 );
        }
    }

    if ( Vec_IntSize( pFxchMan->vCubeFree ) == 0 )
        return -1;

    if ( Vec_IntSize ( pFxchMan->vCubeFree ) == 2 )
    {
        Vec_IntSort( pFxchMan->vCubeFree, 0 );

        Vec_IntWriteEntry( pFxchMan->vCubeFree, 0, Abc_Var2Lit( Vec_IntEntry( pFxchMan->vCubeFree, 0 ), 0 ) );
        Vec_IntWriteEntry( pFxchMan->vCubeFree, 1, Abc_Var2Lit( Vec_IntEntry( pFxchMan->vCubeFree, 1 ), 1 ) );
    }

    Cube0Size = Vec_IntSize( Fxch_ManGetCube( pFxchMan, pSubCube0->iCube ) );
    Cube1Size = Vec_IntSize( Fxch_ManGetCube( pFxchMan, pSubCube1->iCube ) );
    if ( Vec_IntSize( pFxchMan->vCubeFree ) % 2 == 0 )
    {
        Base = Abc_MinInt( Cube0Size, Cube1Size )
               -( Vec_IntSize( pFxchMan->vCubeFree ) / 2)  - 1; /* 1 or 2 Lits, 1 SOP NodeID */
    }
    else
        return -1;

    return Base;
}